

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  ImDrawCmd *pIVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  pIVar2 = (this->CmdBuffer).Data;
  iVar1 = (this->CmdBuffer).Size;
  pIVar8 = pIVar2 + (long)iVar1 + -1;
  uVar7 = pIVar2[(long)iVar1 + -1].ElemCount;
  if ((uVar7 != 0) &&
     (auVar10[0] = -(*(char *)&(this->_CmdHeader).ClipRect.x == *(char *)&(pIVar8->ClipRect).x),
     auVar10[1] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 1) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.x + 1)),
     auVar10[2] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 2) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.x + 2)),
     auVar10[3] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 3) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.x + 3)),
     auVar10[4] = -(*(char *)&(this->_CmdHeader).ClipRect.y ==
                   *(char *)&pIVar2[(long)iVar1 + -1].ClipRect.y),
     auVar10[5] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 1) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.y + 1)),
     auVar10[6] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 2) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.y + 2)),
     auVar10[7] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 3) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.y + 3)),
     auVar10[8] = -(*(char *)&(this->_CmdHeader).ClipRect.z ==
                   *(char *)&pIVar2[(long)iVar1 + -1].ClipRect.z),
     auVar10[9] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 1) ==
                   *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.z + 1)),
     auVar10[10] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 2) ==
                    *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.z + 2)),
     auVar10[0xb] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 3) ==
                     *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.z + 3)),
     auVar10[0xc] = -(*(char *)&(this->_CmdHeader).ClipRect.w ==
                     *(char *)&pIVar2[(long)iVar1 + -1].ClipRect.w),
     auVar10[0xd] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 1) ==
                     *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.w + 1)),
     auVar10[0xe] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 2) ==
                     *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.w + 2)),
     auVar10[0xf] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 3) ==
                     *(char *)((long)&pIVar2[(long)iVar1 + -1].ClipRect.w + 3)),
     (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf)
     != 0xffff)) {
    AddDrawCmd(this);
    return;
  }
  iVar6 = iVar1;
  if (pIVar2[(long)iVar1 + -1].UserCallback != (ImDrawCallback)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x1ef,"_OnChangedClipRect","ImGui ASSERT FAILED: %s",
                "curr_cmd->UserCallback == NULL");
    uVar7 = pIVar2[(long)iVar1 + -1].ElemCount;
    iVar6 = (this->CmdBuffer).Size;
  }
  if (((iVar6 < 2 || uVar7 != 0) ||
      (auVar11[0] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.x ==
                     *(char *)&(this->_CmdHeader).ClipRect.x),
      auVar11[1] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1)),
      auVar11[2] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2)),
      auVar11[3] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3)),
      auVar11[4] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.y ==
                    *(char *)&(this->_CmdHeader).ClipRect.y),
      auVar11[5] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1)),
      auVar11[6] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2)),
      auVar11[7] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3)),
      auVar11[8] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.z ==
                    *(char *)&(this->_CmdHeader).ClipRect.z),
      auVar11[9] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1)),
      auVar11[10] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 2) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2)),
      auVar11[0xb] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3)),
      auVar11[0xc] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.w ==
                      *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar11[0xd] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar11[0xe] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar11[0xf] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar9[0] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.w ==
                   *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar9[1] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 1) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar9[2] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 2) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar9[3] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 3) ==
                   *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar9[4] = -(*(char *)&pIVar2[(long)iVar1 + -2].TextureId ==
                   *(char *)&(this->_CmdHeader).TextureId),
      auVar9[5] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 1) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 1)),
      auVar9[6] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 2) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 2)),
      auVar9[7] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 3) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 3)),
      auVar9[8] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 4) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 4)),
      auVar9[9] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 5) ==
                   *(char *)((long)&(this->_CmdHeader).TextureId + 5)),
      auVar9[10] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 6) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 6)),
      auVar9[0xb] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 7) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 7)),
      auVar9[0xc] = -((char)pIVar2[(long)iVar1 + -2].VtxOffset == (char)(this->_CmdHeader).VtxOffset
                     ),
      auVar9[0xd] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 1) ==
                     *(char *)((long)&(this->_CmdHeader).VtxOffset + 1)),
      auVar9[0xe] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 2) ==
                     *(char *)((long)&(this->_CmdHeader).VtxOffset + 2)),
      auVar9[0xf] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 3) ==
                     *(char *)((long)&(this->_CmdHeader).VtxOffset + 3)), auVar9 = auVar9 & auVar11,
      (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff)) ||
     (pIVar2[(long)iVar1 + -2].UserCallback != (ImDrawCallback)0x0)) {
    fVar3 = (this->_CmdHeader).ClipRect.y;
    fVar4 = (this->_CmdHeader).ClipRect.z;
    fVar5 = (this->_CmdHeader).ClipRect.w;
    (pIVar8->ClipRect).x = (this->_CmdHeader).ClipRect.x;
    (pIVar8->ClipRect).y = fVar3;
    pIVar2[(long)iVar1 + -1].ClipRect.z = fVar4;
    pIVar2[(long)iVar1 + -1].ClipRect.w = fVar5;
  }
  else {
    (this->CmdBuffer).Size = iVar6 + -1;
  }
  return;
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}